

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

void N_VScale_Serial(sunrealtype c,N_Vector x,N_Vector z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  N_Vector in_RSI;
  N_Vector in_RDI;
  sunrealtype in_XMM0_Qa;
  sunrealtype *zd;
  sunrealtype *xd;
  sunindextype N;
  sunindextype i;
  long local_20;
  
  if (in_RSI == in_RDI) {
    VScaleBy_Serial(in_XMM0_Qa,in_RDI);
  }
  else if ((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) {
    if ((in_XMM0_Qa != -1.0) || (NAN(in_XMM0_Qa))) {
      lVar1 = *in_RDI->content;
      lVar2 = *(long *)((long)in_RDI->content + 0x10);
      lVar3 = *(long *)((long)in_RSI->content + 0x10);
      for (local_20 = 0; local_20 < lVar1; local_20 = local_20 + 1) {
        *(double *)(lVar3 + local_20 * 8) = in_XMM0_Qa * *(double *)(lVar2 + local_20 * 8);
      }
    }
    else {
      VNeg_Serial(in_RDI,in_RSI);
    }
  }
  else {
    VCopy_Serial(in_RDI,in_RSI);
  }
  return;
}

Assistant:

void N_VScale_Serial(sunrealtype c, N_Vector x, N_Vector z)
{
  sunindextype i, N;
  sunrealtype *xd, *zd;

  xd = zd = NULL;

  if (z == x)
  { /* BLAS usage: scale x <- cx */
    VScaleBy_Serial(c, x);
    return;
  }

  if (c == ONE) { VCopy_Serial(x, z); }
  else if (c == -ONE) { VNeg_Serial(x, z); }
  else
  {
    N  = NV_LENGTH_S(x);
    xd = NV_DATA_S(x);
    zd = NV_DATA_S(z);
    for (i = 0; i < N; i++) { zd[i] = c * xd[i]; }
  }

  return;
}